

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

int __thiscall QtPrivate::QCalendarModel::columnForFirstOfMonth(QCalendarModel *this,QDate date)

{
  DayOfWeek day;
  int iVar1;
  int iVar2;
  int iVar3;
  QCalendarModel *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  day = QCalendar::dayOfWeek((QDate *)&in_RDI->m_calendar);
  iVar1 = columnForDayOfWeek(in_RDI,day);
  iVar2 = QDate::day(local_10,*(undefined8 *)&in_RDI->m_calendar);
  iVar2 = (iVar2 / 7) * 7 - iVar2;
  iVar3 = iVar1 + iVar2;
  iVar1 = (int)((ulong)((long)(iVar1 + 8 + iVar2) * -0x6db6db6d) >> 0x20) + 8 + iVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ((iVar1 >> 2) - (iVar1 >> 0x1f)) * -7 + 8 + iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QCalendarModel::columnForFirstOfMonth(QDate date) const
{
    return (columnForDayOfWeek(static_cast<Qt::DayOfWeek>(m_calendar.dayOfWeek(date)))
            - (date.day(m_calendar) % 7) + 8) % 7;
}